

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O2

void __thiscall dlib::tt::tensor_rand::tensor_rand(tensor_rand *this,unsigned_long_long seed)

{
  string sStack_38;
  unsigned_long_long local_18;
  
  local_18 = seed;
  rand::rand(&this->rnd);
  cast_to_string<unsigned_long_long>(&sStack_38,&local_18);
  rand::set_seed(&this->rnd,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

tensor_rand::
    tensor_rand(
        unsigned long long seed
    ) 
#ifdef DLIB_USE_CUDA
    :rnd(seed){}